

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O1

void duckdb::ApproximateQuantileBindData::Serialize
               (Serializer *serializer,optional_ptr<duckdb::FunctionData,_true> bind_data_p,
               AggregateFunction *function)

{
  vector<float,_true> *vec;
  optional_ptr<duckdb::FunctionData,_true> local_18;
  
  local_18.ptr = bind_data_p.ptr;
  optional_ptr<duckdb::FunctionData,_true>::CheckValid(&local_18);
  vec = (vector<float,_true> *)(local_18.ptr + 1);
  (*serializer->_vptr_Serializer[2])(serializer,100,"quantiles");
  Serializer::WriteValue<float>(serializer,vec);
  (*serializer->_vptr_Serializer[3])(serializer);
  return;
}

Assistant:

static void Serialize(Serializer &serializer, const optional_ptr<FunctionData> bind_data_p,
	                      const AggregateFunction &function) {
		auto &bind_data = bind_data_p->Cast<ApproximateQuantileBindData>();
		serializer.WriteProperty(100, "quantiles", bind_data.quantiles);
	}